

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * ravi_typename(lua_State *L,int idx)

{
  TValue *o_00;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  o_00 = index2addr(L,idx);
  switch(o_00->tt_ & 0x7f) {
  case 0:
    L_local = (lua_State *)0x19a161;
    break;
  case 1:
    L_local = (lua_State *)anon_var_dwarf_2d2e;
    break;
  case 2:
    L_local = (lua_State *)anon_var_dwarf_2d72;
    break;
  case 3:
    L_local = (lua_State *)0x19d884;
    break;
  case 4:
    L_local = (lua_State *)0x1a2022;
    break;
  case 5:
  case 0x15:
  case 0x25:
    L_local = (lua_State *)raviT_objtypename(L,o_00);
    break;
  case 6:
    L_local = (lua_State *)0x1a39ae;
    break;
  case 7:
    L_local = (lua_State *)luaT_objtypename(L,o_00);
    break;
  case 8:
    L_local = (lua_State *)0x1935d7;
    break;
  default:
    L_local = (lua_State *)anon_var_dwarf_2dc0;
    break;
  case 0x13:
    L_local = (lua_State *)0x192410;
    break;
  case 0x14:
    L_local = (lua_State *)0x1a2022;
    break;
  case 0x16:
    L_local = (lua_State *)anon_var_dwarf_2d7d;
    break;
  case 0x26:
    L_local = (lua_State *)anon_var_dwarf_2d88;
    break;
  case 0x46:
    L_local = (lua_State *)anon_var_dwarf_2daa;
  }
  return (char *)L_local;
}

Assistant:

LUA_API const char *ravi_typename(lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TNIL: return "nil";
    case LUA_TBOOLEAN: return "boolean";
    case LUA_TNUMFLT: return "number";
    case LUA_TNUMINT: return "integer";
    case LUA_TLNGSTR: return "string";
    case LUA_TSHRSTR: return "string";
    case LUA_TUSERDATA: return luaT_objtypename(L, o);
    case LUA_TLIGHTUSERDATA: return "lightuserdata";
    case LUA_TLCF: return "lightCfunction";
    case LUA_TCCL: return "Cclosure";
    case LUA_TLCL: return "closure";
    case RAVI_TFCF: return "fastCfunction";
    case LUA_TTHREAD: return "thread";
    case RAVI_TIARRAY:
    case RAVI_TFARRAY:
    case LUA_TTABLE: return raviT_objtypename(L, o);
    default: return "unknown";
  }
}